

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noisy_laser_tag.cpp
# Opt level: O0

double __thiscall despot::NoisyLaserTag::LaserRange(NoisyLaserTag *this,State *state,int dir)

{
  int iVar1;
  ulong uVar2;
  double dVar3;
  __type _Var4;
  int y;
  int x;
  undefined8 local_38;
  Coord coord;
  undefined8 uStack_2c;
  int d;
  Coord opp;
  Coord rob;
  int dir_local;
  State *state_local;
  NoisyLaserTag *this_local;
  
  std::vector<int,_std::allocator<int>_>::operator[]
            (&(this->super_BaseTag).rob_,(long)*(int *)(state + 0xc));
  _opp = despot::Floor::GetCell((int)this + 0x58);
  std::vector<int,_std::allocator<int>_>::operator[]
            (&(this->super_BaseTag).opp_,(long)*(int *)(state + 0xc));
  uStack_2c = despot::Floor::GetCell((int)this + 0x58);
  _coord = 1;
  while( true ) {
    _y = despot::Coord::operator*((Coord *)(&Compass::DIRECTIONS + dir),_coord);
    local_38 = despot::operator+(&opp,(Coord *)&y);
    iVar1 = Floor::GetIndex(&(this->super_BaseTag).floor_,(Coord *)&local_38);
    if (iVar1 == -1) break;
    uVar2 = despot::operator==((Coord *)&local_38,(Coord *)&stack0xffffffffffffffd4);
    if ((uVar2 & 1) != 0) break;
    _coord = _coord + 1;
  }
  iVar1 = *(int *)((long)&Compass::DIRECTIONS + (long)dir * 8 + 4);
  dVar3 = (double)_coord;
  _Var4 = std::sqrt<int>(*(int *)(&Compass::DIRECTIONS + dir) * *(int *)(&Compass::DIRECTIONS + dir)
                         + iVar1 * iVar1);
  return dVar3 * _Var4;
}

Assistant:

double NoisyLaserTag::LaserRange(const State& state, int dir) const {
	Coord rob = floor_.GetCell(rob_[state.state_id]), opp = floor_.GetCell(
		opp_[state.state_id]);
	int d = 1;
	while (true) {
		Coord coord = rob + Compass::DIRECTIONS[dir] * d;
		if (floor_.GetIndex(coord) == -1 || coord == opp)
			break;
		d++;
	}
	int x = Compass::DIRECTIONS[dir].x, y = Compass::DIRECTIONS[dir].y;

	return d * sqrt(x * x + y * y);
}